

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedmatting.cpp
# Opt level: O2

double __thiscall SharedMatting::nP(SharedMatting *this,int i,int j,Scalar *f,Scalar *b)

{
  int iVar1;
  int l;
  int j_00;
  int k;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double local_90;
  Scalar local_70;
  Scalar local_50;
  
  iVar2 = 1;
  if (1 < i) {
    iVar2 = i;
  }
  iVar2 = iVar2 + -1;
  iVar3 = this->height + -1;
  if (i + 1 <= iVar3) {
    iVar3 = i + 1;
  }
  iVar1 = 1;
  if (1 < j) {
    iVar1 = j;
  }
  iVar4 = this->width + -1;
  if (j + 1 <= iVar4) {
    iVar4 = j + 1;
  }
  local_90 = 0.0;
  for (; j_00 = iVar1 + -1, iVar2 <= iVar3; iVar2 = iVar2 + 1) {
    for (; j_00 <= iVar4; j_00 = j_00 + 1) {
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_50,(double *)f);
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_70,(double *)b);
      dVar5 = mP(this,iVar2,j_00,&local_50,&local_70);
      local_90 = local_90 + dVar5 * dVar5;
    }
  }
  return local_90;
}

Assistant:

double SharedMatting::nP(int i, int j, Scalar f, Scalar b)
{
    int i1 = max(0, i - 1);
    int i2 = min(i + 1, height - 1);
    int j1 = max(0, j - 1);
    int j2 = min(j + 1, width - 1);

    double  result = 0;

    for (int k = i1; k <= i2; ++k)
    {
        for (int l = j1; l <= j2; ++l)
        {
            double m = mP(k, l, f, b);
            result += m * m;
        }
    }

    return result;
}